

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>::
emplaceRealloc<slang::ast::RecursiveStructMemberIterator::State&>
          (SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State> *this,pointer pos,
          State *args)

{
  size_t *psVar1;
  ulong uVar2;
  undefined8 *puVar3;
  ConstantValue *pCVar4;
  Type *pTVar5;
  FieldSymbol **ppFVar6;
  State *__cur_1;
  pointer pSVar7;
  pointer pSVar8;
  pointer pSVar9;
  pointer pSVar10;
  EVP_PKEY_CTX *pEVar11;
  EVP_PKEY_CTX *ctx;
  long lVar12;
  
  if (this->len == 0x333333333333333) {
    detail::throwLengthError();
  }
  pEVar11 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar2 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar2 * 2);
  if (pEVar11 < ctx) {
    pEVar11 = ctx;
  }
  if (0x333333333333333 - uVar2 < uVar2) {
    pEVar11 = (EVP_PKEY_CTX *)0x333333333333333;
  }
  lVar12 = (long)pos - (long)this->data_;
  pSVar7 = (pointer)operator_new((long)pEVar11 * 0x28);
  *(FieldSymbol ***)((long)pSVar7 + lVar12 + 0x20) = (args->fieldEnd)._M_current;
  pCVar4 = args->val;
  pTVar5 = args->type;
  ppFVar6 = (args->fieldIt)._M_current;
  psVar1 = (size_t *)((long)pSVar7 + lVar12 + 0x10);
  *psVar1 = args->valIndex;
  psVar1[1] = (size_t)ppFVar6;
  *(undefined8 *)((long)pSVar7 + lVar12) = pCVar4;
  ((undefined8 *)((long)pSVar7 + lVar12))[1] = pTVar5;
  pSVar10 = this->data_;
  pSVar8 = pSVar10 + this->len;
  pSVar9 = pSVar7;
  if (pSVar8 == pos) {
    for (; pSVar10 != pos; pSVar10 = pSVar10 + 1) {
      (pSVar9->fieldEnd)._M_current = (pSVar10->fieldEnd)._M_current;
      pCVar4 = pSVar10->val;
      pTVar5 = pSVar10->type;
      ppFVar6 = (pSVar10->fieldIt)._M_current;
      pSVar9->valIndex = pSVar10->valIndex;
      (pSVar9->fieldIt)._M_current = ppFVar6;
      pSVar9->val = pCVar4;
      pSVar9->type = pTVar5;
      pSVar9 = pSVar9 + 1;
    }
  }
  else {
    for (; pSVar10 != pos; pSVar10 = pSVar10 + 1) {
      ctx = (EVP_PKEY_CTX *)(pSVar10->fieldEnd)._M_current;
      (pSVar9->fieldEnd)._M_current = (FieldSymbol **)ctx;
      pCVar4 = pSVar10->val;
      pTVar5 = pSVar10->type;
      ppFVar6 = (pSVar10->fieldIt)._M_current;
      pSVar9->valIndex = pSVar10->valIndex;
      (pSVar9->fieldIt)._M_current = ppFVar6;
      pSVar9->val = pCVar4;
      pSVar9->type = pTVar5;
      pSVar9 = pSVar9 + 1;
    }
    puVar3 = (undefined8 *)(lVar12 + (long)pSVar7);
    for (; pos != pSVar8; pos = pos + 1) {
      puVar3[9] = (pos->fieldEnd)._M_current;
      pCVar4 = pos->val;
      pTVar5 = pos->type;
      ppFVar6 = (pos->fieldIt)._M_current;
      puVar3[7] = pos->valIndex;
      puVar3[8] = ppFVar6;
      puVar3[5] = pCVar4;
      puVar3[6] = pTVar5;
      puVar3 = puVar3 + 5;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar11;
  this->data_ = pSVar7;
  return (pointer)((long)pSVar7 + lVar12);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}